

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

int main(int argc,char **argv)

{
  long in_RSI;
  int in_EDI;
  int iters;
  
  if (1 < in_EDI) {
    atoi(*(char **)(in_RSI + 8));
  }
  stamp_run((int)((ulong)in_RSI >> 0x20));
  printf(
        "\n*** WARNING ***: sys/resources.h was not found, so all times\n                 reported are wall-clock time, not user time\n"
        );
  if ((FLAGS_test_4_bytes & 1U) != 0) {
    test_all_maps<HashObject<4,4>>((int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  }
  if ((FLAGS_test_8_bytes & 1U) != 0) {
    test_all_maps<HashObject<8,8>>((int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  }
  if ((FLAGS_test_16_bytes & 1U) != 0) {
    test_all_maps<HashObject<16,16>>((int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  }
  if ((FLAGS_test_256_bytes & 1U) != 0) {
    test_all_maps<HashObject<256,32>>((int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  int iters = kDefaultIters;
  if (argc > 1) {  // first arg is # of iterations
    iters = atoi(argv[1]);
  }

  stamp_run(iters);

#ifndef HAVE_SYS_RESOURCE_H
  printf(
      "\n*** WARNING ***: sys/resources.h was not found, so all times\n"
      "                 reported are wall-clock time, not user time\n");
#endif

  // It would be nice to set these at run-time, but by setting them at
  // compile-time, we allow optimizations that make it as fast to use
  // a HashObject as it would be to use just a straight int/char
  // buffer.  To keep memory use similar, we normalize the number of
  // iterations based on size.
  if (FLAGS_test_4_bytes) test_all_maps<HashObject<4, 4>>(4, iters / 1);
  if (FLAGS_test_8_bytes) test_all_maps<HashObject<8, 8>>(8, iters / 2);
  if (FLAGS_test_16_bytes) test_all_maps<HashObject<16, 16>>(16, iters / 4);
  if (FLAGS_test_256_bytes)
    test_all_maps<HashObject<256, 32>>(256, iters / 32);

  return 0;
}